

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_token_tree.cpp
# Opt level: O2

idx_t __thiscall
duckdb::WindowTokenTree::PeerEnd(WindowTokenTree *this,idx_t lower,idx_t upper,idx_t row_idx)

{
  pointer puVar1;
  pointer puVar2;
  Elements *this_00;
  const_reference pvVar3;
  const_reference pvVar4;
  Elements *this_01;
  const_reference pvVar5;
  const_reference pvVar6;
  unsigned_long *puVar7;
  unsigned_long uVar8;
  vector<unsigned_long,_true> *this_02;
  uint *puVar9;
  vector<unsigned_int,_true> *this_03;
  unsigned_long uVar10;
  uint uVar11;
  long lVar12;
  idx_t iVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  size_type sVar18;
  type pMVar19;
  pointer puVar20;
  size_type __n;
  pointer puVar21;
  ulong uVar22;
  idx_t run_begin;
  type pMVar23;
  idx_t iVar24;
  size_type sVar25;
  bool bVar26;
  size_type local_b0;
  idx_t local_a8;
  idx_t local_a0;
  uint local_8c;
  size_type local_88;
  pointer local_80;
  type local_78;
  ulong local_70;
  ulong local_68;
  type local_60;
  ulong local_58;
  idx_t local_50;
  ulong local_48;
  long local_40;
  size_type local_38;
  
  local_70 = lower;
  local_50 = upper;
  if ((this->super_WindowMergeSortTree).mst64.
      super_unique_ptr<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_*,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>_>
      .
      super__Head_base<0UL,_duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_*,_false>
      ._M_head_impl ==
      (MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL> *)0x0) {
    local_78 = unique_ptr<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_>,_true>
               ::operator*(&(this->super_WindowMergeSortTree).mst32);
    this_01 = MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>::
              LowestLevel(local_78);
    pvVar5 = vector<unsigned_int,_true>::get<true>(this_01,row_idx);
    pMVar23 = local_78;
    local_8c = *pvVar5 + 1;
    if (upper <= lower) {
      return lower;
    }
    uVar17 = lower;
    sVar18 = lower;
    local_a0 = lower;
    if (upper - 1 != lower) {
      uVar22 = 1;
      pMVar19 = (type)0x0;
      uVar17 = upper - 1;
      do {
        uVar15 = uVar17;
        lower = lower >> 5;
        uVar22 = uVar22 * 0x20;
        pMVar19 = (type)((long)pMVar19 + 1);
        uVar17 = uVar15 >> 5;
      } while (lower != uVar15 >> 5);
      sVar18 = uVar22 * uVar15 >> 5;
      if (pMVar19 < 3) {
        local_b0 = local_70;
        lower = local_70;
        uVar17 = local_70;
        local_a0 = sVar18;
        if (pMVar19 == (type)0x0) goto LAB_01ab0073;
      }
      else {
        uVar14 = lower * uVar22;
        local_88 = sVar18;
        pvVar6 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
                 ::get<true>(&local_78->tree,0);
        uVar17 = (long)(pvVar6->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pvVar6->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2;
        if (uVar14 + uVar22 <= uVar17) {
          uVar17 = uVar14 + uVar22;
        }
        pvVar6 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
                 ::get<true>(&pMVar23->tree,(size_type)pMVar19);
        puVar2 = (pvVar6->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar9 = ::std::
                 __lower_bound<unsigned_int_const*,unsigned_int,__gnu_cxx::__ops::_Iter_less_val>
                           (puVar2 + uVar14,puVar2 + uVar17,&local_8c);
        uVar8 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                          ((long)puVar9 - (long)puVar2 >> 2);
        local_68 = (uVar14 / uVar22) * 0x40 + (uVar8 & 0xffffffffffffffe0);
        local_58 = (uVar15 | 0xffffffffffffffe0) + local_68;
        local_68 = (uint)uVar15 & 0x1f | local_68;
        local_40 = -local_70;
        sVar18 = local_88;
        local_b0 = local_70;
        do {
          pMVar23 = local_78;
          sVar25 = local_88;
          local_60 = (type)((long)pMVar19 - 1);
          uVar22 = uVar22 >> 5;
          pvVar6 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
                   ::get<true>(&local_78->tree,(size_type)local_60);
          local_80 = (pointer)(pvVar6->first).
                              super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start;
          local_38 = (size_type)pMVar19;
          pvVar6 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
                   ::get<true>(&pMVar23->tree,(size_type)pMVar19);
          this_03 = &pvVar6->second;
          uVar17 = local_58 + 0x1f;
          while (uVar22 <= local_40 + sVar25) {
            pvVar5 = vector<unsigned_int,_true>::get<true>(this_03,uVar17);
            puVar1 = local_80;
            lVar12 = (ulong)*pvVar5 * 4 + (long)local_80;
            pvVar5 = vector<unsigned_int,_true>::get<true>(this_03,uVar17 + 0x20);
            puVar9 = ::std::
                     __lower_bound<unsigned_int_const*,unsigned_int,__gnu_cxx::__ops::_Iter_comp_val<std::less<unsigned_int>>>
                               (lVar12,(ulong)*pvVar5 * 4 + (long)puVar1,&local_8c);
            sVar25 = sVar25 - uVar22;
            uVar8 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                              ((long)puVar9 - (long)puVar1 >> 2);
            local_b0 = (local_b0 - sVar25) + uVar8;
            uVar17 = uVar17 - 1;
          }
          local_88 = sVar25;
          if (local_40 + sVar25 != 0) {
            pvVar5 = vector<unsigned_int,_true>::get<true>(this_03,uVar17);
            puVar1 = local_80;
            lVar12 = (long)local_80 + (ulong)*pvVar5 * 4;
            pvVar5 = vector<unsigned_int,_true>::get<true>(this_03,uVar17 + 0x20);
            puVar9 = ::std::
                     __lower_bound<unsigned_int_const*,unsigned_int,__gnu_cxx::__ops::_Iter_comp_val<std::less<unsigned_int>>>
                               (lVar12,(long)puVar1 + (ulong)*pvVar5 * 4,&local_8c);
            uVar8 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                              ((long)puVar9 - (long)puVar1 >> 2);
            uVar17 = (local_70 / uVar22) * 0x40 + (uVar8 & 0xffffffffffffffe0);
          }
          local_58 = uVar17;
          uVar17 = local_68;
          for (lVar12 = -sVar18; iVar24 = local_50, uVar22 <= local_50 + lVar12;
              lVar12 = lVar12 - uVar22) {
            pvVar5 = vector<unsigned_int,_true>::get<true>(this_03,uVar17);
            puVar1 = local_80;
            lVar16 = (ulong)*pvVar5 * 4 + (long)local_80;
            pvVar5 = vector<unsigned_int,_true>::get<true>(this_03,uVar17 + 0x20);
            puVar9 = ::std::
                     __lower_bound<unsigned_int_const*,unsigned_int,__gnu_cxx::__ops::_Iter_comp_val<std::less<unsigned_int>>>
                               (lVar16,(ulong)*pvVar5 * 4 + (long)puVar1,&local_8c);
            uVar8 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                              ((long)puVar9 - (long)puVar1 >> 2);
            local_b0 = (local_b0 - sVar18) + uVar8;
            sVar18 = sVar18 + uVar22;
            uVar17 = uVar17 + 1;
          }
          if (local_50 + lVar12 != 0) {
            pvVar5 = vector<unsigned_int,_true>::get<true>(this_03,uVar17);
            puVar1 = local_80;
            lVar16 = (ulong)*pvVar5 * 4 + (long)local_80;
            pvVar5 = vector<unsigned_int,_true>::get<true>(this_03,uVar17 + 0x20);
            puVar9 = ::std::
                     __lower_bound<unsigned_int_const*,unsigned_int,__gnu_cxx::__ops::_Iter_comp_val<std::less<unsigned_int>>>
                               (lVar16,(ulong)*pvVar5 * 4 + (long)puVar1,&local_8c);
            uVar8 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                              ((long)puVar9 - (long)puVar1 >> 2);
            uVar17 = (iVar24 / uVar22) * 0x40 + (uVar8 & 0xffffffffffffffe0);
          }
          local_68 = uVar17;
          sVar18 = -lVar12;
          pMVar19 = local_60;
        } while (2 < local_38);
        pMVar19 = (type)0x1;
        sVar18 = local_88;
        upper = local_50;
        local_a0 = -lVar12;
      }
      local_80 = (pointer)-local_70;
      while (__n = (long)pMVar19 - 1, lower = local_b0, uVar17 = local_70, __n != 0) {
        uVar22 = uVar22 >> 5;
        local_60 = (type)__n;
        pvVar6 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
                 ::get<true>(&local_78->tree,__n);
        puVar2 = (pvVar6->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar12 = sVar18 * 4;
        puVar21 = puVar2 + sVar18;
        for (; upper = local_50, uVar22 <= (long)local_80 + sVar18; sVar18 = sVar18 - uVar22) {
          puVar9 = ::std::
                   __lower_bound<unsigned_int_const*,unsigned_int,__gnu_cxx::__ops::_Iter_comp_val<std::less<unsigned_int>>>
                             (puVar21 + -uVar22,puVar21,&local_8c);
          uVar8 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                            ((long)puVar9 - (long)puVar2 >> 2);
          uVar10 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                             ((long)(uVar22 * -4 + lVar12) >> 2);
          local_b0 = (uVar8 + local_b0) - uVar10;
          lVar12 = lVar12 + uVar22 * -4;
          puVar21 = puVar21 + -uVar22;
        }
        uVar17 = local_50 - local_a0;
        puVar21 = puVar2 + local_a0;
        local_88 = sVar18;
        while (bVar26 = uVar22 <= uVar17, uVar17 = uVar17 - uVar22, pMVar19 = local_60,
              sVar18 = local_88, bVar26) {
          puVar9 = ::std::
                   __lower_bound<unsigned_int_const*,unsigned_int,__gnu_cxx::__ops::_Iter_comp_val<std::less<unsigned_int>>>
                             (puVar21,puVar21 + uVar22,&local_8c);
          uVar8 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                            ((long)puVar9 - (long)puVar2 >> 2);
          uVar10 = NumericCastImpl<unsigned_long,_long,_false>::Convert(local_a0);
          local_b0 = (uVar8 + local_b0) - uVar10;
          local_a0 = local_a0 + uVar22;
          puVar21 = puVar21 + uVar22;
        }
      }
    }
LAB_01ab0073:
    pvVar6 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
             ::get<true>(&local_78->tree,0);
    puVar2 = (pvVar6->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (; sVar18 != uVar17; uVar17 = uVar17 + 1) {
      lower = lower + (puVar2[uVar17] < local_8c);
    }
    for (; upper != local_a0; local_a0 = local_a0 + 1) {
      lower = lower + (puVar2[local_a0] < local_8c);
    }
    return lower;
  }
  local_60 = unique_ptr<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>,_true>
             ::operator*(&(this->super_WindowMergeSortTree).mst64);
  this_00 = MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>::
            LowestLevel(local_60);
  pvVar3 = vector<unsigned_long,_true>::get<true>(this_00,row_idx);
  pMVar19 = local_60;
  local_48 = *pvVar3 + 1;
  if (upper <= lower) {
    return lower;
  }
  uVar17 = lower;
  iVar24 = lower;
  local_a8 = lower;
  if (upper - 1 != lower) {
    uVar22 = 1;
    sVar18 = 0;
    uVar17 = upper - 1;
    iVar13 = lower;
    do {
      uVar15 = uVar17;
      iVar13 = iVar13 >> 5;
      uVar22 = uVar22 * 0x20;
      sVar18 = sVar18 + 1;
      uVar17 = uVar15 >> 5;
    } while (iVar13 != uVar15 >> 5);
    uVar17 = uVar22 * uVar15 >> 5;
    if (sVar18 < 3) {
      local_b0 = lower;
      local_a8 = uVar17;
      if (sVar18 == 0) goto LAB_01aafffd;
    }
    else {
      uVar14 = iVar13 * uVar22;
      local_88 = sVar18;
      local_78 = (type)uVar15;
      local_58 = uVar17;
      pvVar4 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
               ::get<true>(&local_60->tree,0);
      sVar18 = local_88;
      uVar17 = (long)(pvVar4->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pvVar4->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      if (uVar14 + uVar22 <= uVar17) {
        uVar17 = uVar14 + uVar22;
      }
      pvVar4 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
               ::get<true>(&pMVar19->tree,local_88);
      puVar1 = (pvVar4->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar7 = ::std::
               __lower_bound<unsigned_long_const*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                         (puVar1 + uVar14,puVar1 + uVar17,&local_48);
      uVar8 = NumericCastImpl<unsigned_long,_long,_false>::Convert((long)puVar7 - (long)puVar1 >> 3)
      ;
      local_68 = (uVar14 / uVar22) * 0x40 + (uVar8 & 0xffffffffffffffe0);
      uVar11 = (uint)local_78;
      local_78 = (type)(((ulong)local_78 | 0xffffffffffffffe0) + local_68);
      local_68 = uVar11 & 0x1f | local_68;
      local_40 = -lower;
      uVar17 = local_58;
      do {
        uVar15 = local_58;
        pMVar19 = local_60;
        local_88 = sVar18 - 1;
        uVar22 = uVar22 >> 5;
        pvVar4 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                 ::get<true>(&local_60->tree,local_88);
        local_80 = (pvVar4->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
        local_38 = sVar18;
        pvVar4 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                 ::get<true>(&pMVar19->tree,sVar18);
        this_02 = &pvVar4->second;
        pMVar23 = (type)((long)local_78 + 0x1f);
        local_b0 = lower;
        while (uVar22 <= local_40 + uVar15) {
          pvVar3 = vector<unsigned_long,_true>::get<true>(this_02,(size_type)pMVar23);
          puVar20 = local_80;
          puVar1 = local_80 + *pvVar3;
          pvVar3 = vector<unsigned_long,_true>::get<true>(this_02,(long)pMVar23 + 0x20);
          puVar7 = ::std::
                   __lower_bound<unsigned_long_const*,unsigned_long,__gnu_cxx::__ops::_Iter_comp_val<std::less<unsigned_long>>>
                             (puVar1,puVar20 + *pvVar3,&local_48);
          uVar15 = uVar15 - uVar22;
          uVar8 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                            ((long)puVar7 - (long)puVar20 >> 3);
          local_b0 = (local_b0 - uVar15) + uVar8;
          pMVar23 = (type)((long)pMVar23 - 1);
        }
        local_58 = uVar15;
        if (local_40 + uVar15 != 0) {
          pvVar3 = vector<unsigned_long,_true>::get<true>(this_02,(size_type)pMVar23);
          puVar20 = local_80;
          puVar1 = local_80 + *pvVar3;
          pvVar3 = vector<unsigned_long,_true>::get<true>(this_02,(long)pMVar23 + 0x20);
          puVar7 = ::std::
                   __lower_bound<unsigned_long_const*,unsigned_long,__gnu_cxx::__ops::_Iter_comp_val<std::less<unsigned_long>>>
                             (puVar1,puVar20 + *pvVar3,&local_48);
          uVar8 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                            ((long)puVar7 - (long)puVar20 >> 3);
          pMVar23 = (type)((local_70 / uVar22) * 0x40 + (uVar8 & 0xffffffffffffffe0));
        }
        local_78 = pMVar23;
        upper = local_50;
        uVar15 = local_68;
        for (lVar12 = -uVar17; uVar22 <= lVar12 + upper; lVar12 = lVar12 - uVar22) {
          pvVar3 = vector<unsigned_long,_true>::get<true>(this_02,uVar15);
          puVar20 = local_80;
          puVar1 = local_80 + *pvVar3;
          pvVar3 = vector<unsigned_long,_true>::get<true>(this_02,uVar15 + 0x20);
          puVar7 = ::std::
                   __lower_bound<unsigned_long_const*,unsigned_long,__gnu_cxx::__ops::_Iter_comp_val<std::less<unsigned_long>>>
                             (puVar1,puVar20 + *pvVar3,&local_48);
          uVar8 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                            ((long)puVar7 - (long)puVar20 >> 3);
          local_b0 = (local_b0 - uVar17) + uVar8;
          uVar17 = uVar17 + uVar22;
          uVar15 = uVar15 + 1;
        }
        if (upper + lVar12 != 0) {
          pvVar3 = vector<unsigned_long,_true>::get<true>(this_02,uVar15);
          puVar20 = local_80;
          puVar1 = local_80 + *pvVar3;
          pvVar3 = vector<unsigned_long,_true>::get<true>(this_02,uVar15 + 0x20);
          puVar7 = ::std::
                   __lower_bound<unsigned_long_const*,unsigned_long,__gnu_cxx::__ops::_Iter_comp_val<std::less<unsigned_long>>>
                             (puVar1,puVar20 + *pvVar3,&local_48);
          uVar8 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                            ((long)puVar7 - (long)puVar20 >> 3);
          uVar15 = (upper / uVar22) * 0x40 + (uVar8 & 0xffffffffffffffe0);
        }
        local_68 = uVar15;
        uVar17 = -lVar12;
        sVar18 = local_88;
        lower = local_b0;
      } while (2 < local_38);
      sVar18 = 1;
      uVar17 = local_58;
      lower = local_70;
      local_a8 = -lVar12;
    }
    local_80 = (pointer)-lower;
    while (sVar18 = sVar18 - 1, iVar24 = local_b0, sVar18 != 0) {
      uVar22 = uVar22 >> 5;
      local_88 = sVar18;
      pvVar4 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
               ::get<true>(&local_60->tree,sVar18);
      puVar1 = (pvVar4->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar12 = uVar17 * 8;
      puVar20 = puVar1 + uVar17;
      for (; uVar22 <= (long)local_80 + uVar17; uVar17 = uVar17 - uVar22) {
        puVar7 = ::std::
                 __lower_bound<unsigned_long_const*,unsigned_long,__gnu_cxx::__ops::_Iter_comp_val<std::less<unsigned_long>>>
                           (puVar20 + -uVar22,puVar20,&local_48);
        uVar8 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                          ((long)puVar7 - (long)puVar1 >> 3);
        uVar10 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                           ((long)(uVar22 * -8 + lVar12) >> 3);
        local_b0 = (uVar8 + local_b0) - uVar10;
        lVar12 = lVar12 + uVar22 * -8;
        puVar20 = puVar20 + -uVar22;
      }
      uVar15 = local_50 - local_a8;
      puVar20 = puVar1 + local_a8;
      while (bVar26 = uVar22 <= uVar15, uVar15 = uVar15 - uVar22, sVar18 = local_88,
            lower = local_70, upper = local_50, bVar26) {
        puVar7 = ::std::
                 __lower_bound<unsigned_long_const*,unsigned_long,__gnu_cxx::__ops::_Iter_comp_val<std::less<unsigned_long>>>
                           (puVar20,puVar20 + uVar22,&local_48);
        uVar8 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                          ((long)puVar7 - (long)puVar1 >> 3);
        uVar10 = NumericCastImpl<unsigned_long,_long,_false>::Convert(local_a8);
        local_b0 = (uVar8 + local_b0) - uVar10;
        local_a8 = local_a8 + uVar22;
        puVar20 = puVar20 + uVar22;
      }
    }
  }
LAB_01aafffd:
  pvVar4 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
           ::get<true>(&local_60->tree,0);
  puVar1 = (pvVar4->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (; uVar17 != lower; lower = lower + 1) {
    iVar24 = iVar24 + (puVar1[lower] < local_48);
  }
  for (; upper != local_a8; local_a8 = local_a8 + 1) {
    iVar24 = iVar24 + (puVar1[local_a8] < local_48);
  }
  return iVar24;
}

Assistant:

idx_t WindowTokenTree::PeerEnd(const idx_t lower, const idx_t upper, const idx_t row_idx) const {
	if (mst64) {
		return NextPeer(*mst64, lower, upper, row_idx);
	} else {
		return NextPeer(*mst32, lower, upper, row_idx);
	}
}